

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void update_min_count(log_multi *b,uint32_t node)

{
  node *pnVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)node;
  while( true ) {
    if ((int)uVar3 == 0) {
      return;
    }
    pnVar1 = (b->nodes)._begin;
    uVar4 = (ulong)pnVar1[uVar3].parent;
    if (pnVar1[uVar4].min_count == pnVar1[uVar3].min_count) break;
    uVar2 = pnVar1[pnVar1[uVar4].left].min_count;
    if (pnVar1[pnVar1[uVar4].right].min_count < pnVar1[pnVar1[uVar4].left].min_count) {
      uVar2 = pnVar1[pnVar1[uVar4].right].min_count;
    }
    pnVar1[uVar4].min_count = uVar2;
    uVar3 = uVar4;
  }
  return;
}

Assistant:

inline void update_min_count(log_multi& b, uint32_t node)
{
  // Constant time min count update.
  while (node != 0)
  {
    uint32_t prev = node;
    node = b.nodes[node].parent;

    if (b.nodes[node].min_count == b.nodes[prev].min_count)
      break;
    else
      b.nodes[node].min_count = min_left_right(b, b.nodes[node]);
  }
}